

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

FrameDisplay *
TTD::NSSnapValues::InflateScriptFunctionScopeInfo
          (ScriptFunctionScopeInfo *funcScopeInfo,InflateMap *inflator)

{
  int iVar1;
  Recycler *pRVar2;
  FrameDisplay *this;
  int *piVar3;
  RecyclableObject *item;
  Type *item_00;
  Type *saval;
  Var sval;
  ScopeInfoEntry *scp;
  uint16 i;
  TrackAllocData local_50;
  FrameDisplay *local_28;
  FrameDisplay *environment;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  ScriptFunctionScopeInfo *funcScopeInfo_local;
  
  ctx = (ScriptContext *)inflator;
  inflator_local = (InflateMap *)funcScopeInfo;
  environment = (FrameDisplay *)
                InflateMap::LookupScriptContext(inflator,funcScopeInfo->ScriptContextLogId);
  pRVar2 = Js::ScriptContext::GetRecycler((ScriptContext *)environment);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&Js::FrameDisplay::typeinfo,
             (ulong)*(ushort *)&(inflator_local->m_handlerMap).m_hashArray << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSnapValues.cpp"
             ,0x300);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  this = (FrameDisplay *)new<Memory::Recycler>(8,pRVar2,0x446fd0,0);
  Js::FrameDisplay::FrameDisplay(this,*(uint16 *)&(inflator_local->m_handlerMap).m_hashArray,false);
  scp._6_2_ = 0;
  local_28 = this;
  do {
    if (*(ushort *)&(inflator_local->m_handlerMap).m_hashArray <= scp._6_2_) {
      return local_28;
    }
    piVar3 = (int *)(*(long *)&(inflator_local->m_handlerMap).m_count + (ulong)scp._6_2_ * 0x10);
    iVar1 = *piVar3;
    if (iVar1 == 0) {
LAB_00d3ca83:
      item = InflateMap::LookupObject((InflateMap *)ctx,*(TTD_PTR_ID *)(piVar3 + 2));
      Js::FrameDisplay::SetItem(local_28,(uint)scp._6_2_,item);
    }
    else {
      if (iVar1 != 1) {
        if (iVar1 != 2) {
          TTDAbort_unrecoverable_error("Unknown scope kind");
        }
        goto LAB_00d3ca83;
      }
      item_00 = InflateMap::LookupSlotArray((InflateMap *)ctx,*(TTD_PTR_ID *)(piVar3 + 2));
      Js::FrameDisplay::SetItem(local_28,(uint)scp._6_2_,item_00);
    }
    scp._6_2_ = scp._6_2_ + 1;
  } while( true );
}

Assistant:

Js::FrameDisplay* InflateScriptFunctionScopeInfo(const ScriptFunctionScopeInfo* funcScopeInfo, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(funcScopeInfo->ScriptContextLogId);

            Js::FrameDisplay* environment = RecyclerNewPlus(ctx->GetRecycler(), funcScopeInfo->ScopeCount * sizeof(Js::Var), Js::FrameDisplay, funcScopeInfo->ScopeCount);

            for(uint16 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                const ScopeInfoEntry& scp = funcScopeInfo->ScopeArray[i];

                switch(scp.Tag)
                {
                case Js::ScopeType::ScopeType_ActivationObject:
                case Js::ScopeType::ScopeType_WithScope:
                {
                    Js::Var sval = inflator->LookupObject(scp.IDValue);
                    environment->SetItem(i, sval);
                    break;
                }
                case Js::ScopeType::ScopeType_SlotArray:
                {
                    Field(Js::Var)* saval = inflator->LookupSlotArray(scp.IDValue);
                    environment->SetItem(i, saval);
                    break;
                }
                default:
                    TTDAssert(false, "Unknown scope kind");
                    break;
                }
            }

            return environment;
        }